

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlibemu_opl_inc.c
# Opt level: O1

void change_decayrate(OPL_DATA_conflict *chip,Bitu regbase,op_type_conflict *op_pt)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  double dVar4;
  double dVar5;
  
  uVar3 = chip->adlibreg[(ulong)regbase + 0x60] & 0xf;
  if ((chip->adlibreg[(ulong)regbase + 0x60] & 0xf) == 0) {
    op_pt->decaymul = 1.0;
    uVar2 = 0;
  }
  else {
    dVar5 = decrelconst[op_pt->toff & 3];
    dVar1 = chip->recipsamp;
    dVar4 = exp2((double)((op_pt->toff >> 2) + uVar3));
    dVar5 = exp2(dVar4 * dVar5 * -7.4493 * dVar1);
    op_pt->decaymul = dVar5;
    uVar3 = (op_pt->toff >> 2) + uVar3;
    uVar2 = ~(-1 << (0xcU - (char)uVar3 & 0x1f));
    if (0xc < (uVar3 & 0x3fffffff)) {
      uVar2 = 0;
    }
  }
  op_pt->env_step_d = uVar2;
  return;
}

Assistant:

static void change_decayrate(OPL_DATA* chip, Bitu regbase, op_type* op_pt)
{
	Bits decayrate = chip->adlibreg[ARC_ATTR_DECR+regbase]&15;
	// decaymul should be 1.0 when decayrate==0
	if (decayrate) {
		Bits steps;
		
		fltype f = (fltype)(-7.4493*decrelconst[op_pt->toff&3]*chip->recipsamp);
		op_pt->decaymul = (fltype)(pow(FL2,f*pow(FL2,(fltype)(decayrate+(op_pt->toff>>2)))));
		steps = (decayrate*4 + op_pt->toff) >> 2;
		op_pt->env_step_d = (1<<(steps<=12?12-steps:0))-1;
	}
	else
	{
		op_pt->decaymul = 1.0;
		op_pt->env_step_d = 0;
	}
}